

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Bounds3<float> * __thiscall
pbrt::Expand<float,float>
          (Bounds3<float> *__return_storage_ptr__,pbrt *this,Bounds3<float> *b,float delta)

{
  undefined8 uVar1;
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Point3<float> PVar5;
  Vector3<float> local_24;
  
  auVar4 = in_register_00001204._4_56_;
  local_24.super_Tuple3<pbrt::Vector3,_float>.x = delta;
  local_24.super_Tuple3<pbrt::Vector3,_float>.y = delta;
  local_24.super_Tuple3<pbrt::Vector3,_float>.z = delta;
  PVar5 = Point3<float>::operator-((Point3<float> *)this,&local_24);
  auVar2._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar4;
  uVar1 = vmovlps_avx(auVar2._0_16_);
  (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  auVar4 = (undefined1  [56])0x0;
  (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z =
       PVar5.super_Tuple3<pbrt::Point3,_float>.z;
  local_24.super_Tuple3<pbrt::Vector3,_float>.x = delta;
  local_24.super_Tuple3<pbrt::Vector3,_float>.y = delta;
  local_24.super_Tuple3<pbrt::Vector3,_float>.z = delta;
  PVar5 = Point3<float>::operator+((Point3<float> *)(this + 0xc),&local_24);
  auVar3._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar4;
  uVar1 = vmovlps_avx(auVar3._0_16_);
  (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z =
       PVar5.super_Tuple3<pbrt::Point3,_float>.z;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU inline Bounds3<T> Expand(const Bounds3<T> &b, U delta) {
    Bounds3<T> ret;
    ret.pMin = b.pMin - Vector3<T>(delta, delta, delta);
    ret.pMax = b.pMax + Vector3<T>(delta, delta, delta);
    return ret;
}